

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

_Bool parse_vrp_file(Instance *instance,FILE *filehandle,char *filepath)

{
  bool bVar1;
  _Bool _Var2;
  byte bVar3;
  size_t sVar4;
  char *__ptr;
  int64_t iVar5;
  double *pdVar6;
  _Bool local_105;
  int local_104;
  int local_100;
  int32_t secid_1;
  int32_t secid;
  _Bool found_matching_section;
  _Bool done;
  anon_struct_24_4_1626e806 sections [5];
  undefined1 auStack_70 [7];
  _Bool needs_edge_section;
  VrplibParser parser;
  size_t readamt;
  char *buffer;
  size_t filesize;
  _Bool result;
  char *filepath_local;
  FILE *filehandle_local;
  Instance *instance_local;
  
  filesize._7_1_ = true;
  sVar4 = get_file_size(filehandle);
  __ptr = (char *)malloc(sVar4 + 1);
  if (__ptr == (char *)0x0) {
    filesize._7_1_ = false;
  }
  else {
    parser._40_8_ = fread(__ptr,1,sVar4,(FILE *)filehandle);
    if (parser._40_8_ == sVar4) {
      __ptr[sVar4] = '\0';
      memset(auStack_70,0,0x30);
      _auStack_70 = filepath;
      parser.filename = __ptr;
      parser.base = __ptr;
      parser._24_8_ = sVar4;
      _Var2 = parse_vrplib_hdr((VrplibParser *)auStack_70,instance);
      if (_Var2) {
        if (instance->num_customers < 1) {
          parse_error((VrplibParser *)auStack_70,
                      "couldn\'t deduce number of customers after parsing the VRPLIB header");
          filesize._7_1_ = false;
        }
        else if (0.0 < instance->vehicle_cap) {
          _Var2 = prep_memory(instance);
          if (_Var2) {
            _Var2 = parser_needs_edge_section((VrplibParser *)auStack_70);
            if (_Var2) {
              iVar5 = hm_nentries(instance->num_customers + 1);
              pdVar6 = (double *)malloc(iVar5 << 3);
              instance->edge_weight = pdVar6;
              if (instance->edge_weight == (double *)0x0) {
                log_log(0x80,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/parser.c"
                        ,0x2c9,"Failed to prepare memory for storing instance");
                filesize._7_1_ = false;
                goto LAB_00104545;
              }
            }
            _secid = "NODE_COORD_SECTION";
            sections[0].name = (char *)parse_vrplib_nodecoord_section;
            sections[0].parse_fn._0_1_ = 1;
            sections[0].parse_fn._1_1_ = 0;
            sections[0]._16_8_ = anon_var_dwarf_1062;
            sections[1].name = (char *)parse_vrplib_demand_section;
            sections[1].parse_fn._0_1_ = 1;
            sections[1].parse_fn._1_1_ = 0;
            sections[1]._16_8_ = (long)"Expected valid integer for DEPOT_SECTION" + 0x1b;
            sections[2].name = (char *)parse_vrplib_depot_section;
            sections[2].parse_fn._0_1_ = 1;
            sections[2].parse_fn._1_1_ = 0;
            sections[2]._16_8_ = anon_var_dwarf_1090;
            sections[3].name = (char *)parse_vrplib_profit_section;
            sections[3].parse_fn._0_1_ = 0;
            sections[3].parse_fn._1_1_ = 0;
            sections[3]._16_8_ = anon_var_dwarf_109b;
            sections[4].name = (char *)parse_vrplib_edge_weight_section;
            sections[4].parse_fn._1_1_ = 0;
            sections[4].parse_fn._0_1_ = _Var2;
            while (filesize._7_1_ != false) {
              _Var2 = parser_is_eof((VrplibParser *)auStack_70);
              local_105 = true;
              if (!_Var2) {
                local_105 = parser_match_string((VrplibParser *)auStack_70,"EOF");
              }
              if (local_105 != false) break;
              bVar1 = false;
              for (local_100 = 0; local_100 < 5; local_100 = local_100 + 1) {
                _Var2 = parser_match_string((VrplibParser *)auStack_70,
                                            *(char **)(&secid + (long)local_100 * 6));
                if ((_Var2) && (_Var2 = parser_match_newline((VrplibParser *)auStack_70), _Var2)) {
                  if (((ulong)sections[local_100].parse_fn & 0x100) == 0) {
                    *(undefined1 *)((long)&sections[local_100].parse_fn + 1) = 1;
                    bVar1 = true;
                    bVar3 = (*(code *)sections[local_100].name)(auStack_70,instance);
                    filesize._7_1_ = (_Bool)(bVar3 & 1);
                    if (filesize._7_1_ == false) {
                      parse_error((VrplibParser *)auStack_70,"Failure while parsing section `%s`",
                                  *(undefined8 *)(&secid + (long)local_100 * 6));
                      filesize._7_1_ = false;
                    }
                  }
                  else {
                    parse_error((VrplibParser *)auStack_70,"Multiple definitions for section `%s`",
                                *(undefined8 *)(&secid + (long)local_100 * 6));
                    filesize._7_1_ = false;
                  }
                  break;
                }
              }
              if (!bVar1) {
                parse_error((VrplibParser *)auStack_70,"invalid input");
                filesize._7_1_ = false;
              }
            }
            if (filesize._7_1_ != false) {
              parser_eat_all_blanks((VrplibParser *)auStack_70);
              sVar4 = parser_remainder_size((VrplibParser *)auStack_70);
              if (sVar4 == 0) {
                for (local_104 = 0; local_104 < 5; local_104 = local_104 + 1) {
                  if ((((ulong)sections[local_104].parse_fn & 1) != 0) &&
                     (((ulong)sections[local_104].parse_fn & 0x100) == 0)) {
                    parse_error((VrplibParser *)auStack_70,"Required section `%s` was not found",
                                *(undefined8 *)(&secid + (long)local_104 * 6));
                    filesize._7_1_ = false;
                    goto LAB_00104545;
                  }
                }
                if ((*instance->demands != 0.0) || (NAN(*instance->demands))) {
                  parse_error((VrplibParser *)auStack_70,
                              "demand for the depot node should be `0`. Got `%f` instead",
                              *instance->demands);
                  filesize._7_1_ = false;
                }
              }
              else {
                parse_error((VrplibParser *)auStack_70,
                            "Found premature `EOF` while more input is still available");
                filesize._7_1_ = false;
              }
            }
          }
          else {
            log_log(0x80,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/parser.c"
                    ,0x2bd,"Failed to prepare memory for storing instance");
            filesize._7_1_ = false;
          }
        }
        else {
          parse_error((VrplibParser *)auStack_70,
                      "couldn\'t deduce vehicle capacity after parsing the VRPLIB header");
          filesize._7_1_ = false;
        }
      }
      else {
        filesize._7_1_ = false;
      }
    }
    else {
      filesize._7_1_ = false;
    }
  }
LAB_00104545:
  if (__ptr != (char *)0x0) {
    free(__ptr);
  }
  return filesize._7_1_;
}

Assistant:

bool parse_vrp_file(Instance *instance, FILE *filehandle,
                    const char *filepath) {

    bool result = true;
    size_t filesize = get_file_size(filehandle);

    // + 1 for null termination
    char *buffer = malloc(filesize + 1);
    if (!buffer) {
        result = false;
        goto terminate;
    }

    size_t readamt = fread(buffer, 1, filesize, filehandle);
    if (readamt != filesize) {
        result = false;
        goto terminate;
    }

    // NULL terminate the buffer
    buffer[filesize] = 0;
    VrplibParser parser = {0};
    parser.filename = filepath;
    parser.base = buffer;
    parser.at = buffer;
    parser.size = filesize;

    // First extract the header information
    if (!parse_vrplib_hdr(&parser, instance)) {
        result = false;
        goto terminate;
    }

    if (instance->num_customers <= 0) {
        parse_error(&parser, "couldn't deduce number of customers after "
                             "parsing the VRPLIB header");
        result = false;
        goto terminate;
    } else if (instance->vehicle_cap <= 0.0) {
        parse_error(&parser, "couldn't deduce vehicle capacity after "
                             "parsing the VRPLIB header");
        result = false;
        goto terminate;
    }

    if (!prep_memory(instance)) {
        log_fatal("Failed to prepare memory for storing instance");
        result = false;
        goto terminate;
    }

    bool needs_edge_section = parser_needs_edge_section(&parser);

    if (needs_edge_section) {
        instance->edge_weight =
            malloc(hm_nentries(1 + instance->num_customers) *
                   sizeof(*instance->edge_weight));
        if (!instance->edge_weight) {
            log_fatal("Failed to prepare memory for storing instance");
            result = false;
            goto terminate;
        }
    }

    struct {
        char *name;
        bool (*parse_fn)(VrplibParser *p, Instance *instance);
        bool required;
        bool found;
    } sections[] = {
        {"NODE_COORD_SECTION", parse_vrplib_nodecoord_section, 1, 0},
        {"DEMAND_SECTION", parse_vrplib_demand_section, 1, 0},
        {"DEPOT_SECTION", parse_vrplib_depot_section, 1, 0},
        {"PROFIT_SECTION", parse_vrplib_profit_section, 0, 0},
        {"EDGE_WEIGHT_SECTION", parse_vrplib_edge_weight_section,
         needs_edge_section, 0},
    };

    while (result) {
        bool done =
            parser_is_eof(&parser) || parser_match_string(&parser, "EOF");
        if (done) {
            break;
        }

        bool found_matching_section = false;
        for (int32_t secid = 0; secid < ARRAY_LEN_i32(sections); secid++) {
            if (parser_match_string(&parser, sections[secid].name) &&
                parser_match_newline(&parser)) {
                if (sections[secid].found) {
                    parse_error(&parser,
                                "Multiple definitions for section `%s`",
                                sections[secid].name);
                    result = false;
                    break;
                }

                sections[secid].found = true;
                found_matching_section = true;
                result = sections[secid].parse_fn(&parser, instance);
                if (!result) {
                    parse_error(&parser, "Failure while parsing section `%s`",
                                sections[secid].name);
                    result = false;
                }
                break;
            }
        }
        if (!found_matching_section) {
            parse_error(&parser, "invalid input");
            result = false;
        }
    }

    if (result) {

        // Keep eating whitespaces and newlines while there are any
        parser_eat_all_blanks(&parser);

        if (parser_remainder_size(&parser) != 0) {
            parse_error(&parser, "Found premature `EOF` while more input "
                                 "is still available");
            result = false;
            goto terminate;
        }

        for (int32_t secid = 0; secid < ARRAY_LEN_i32(sections); secid++) {
            if (sections[secid].required && !sections[secid].found) {
                parse_error(&parser, "Required section `%s` was not found",
                            sections[secid].name);
                result = false;
                goto terminate;
            }
        }

        if (instance->demands[0] != 0) {
            parse_error(
                &parser,
                "demand for the depot node should be `0`. Got `%f` instead",
                instance->demands[0]);
            result = false;
            goto terminate;
        }
    }

terminate:
    if (buffer) {
        free(buffer);
    }
    return result;
}